

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 7zArcIn.c
# Opt level: O0

SRes ReadTime(CSzBitUi64s *p,UInt32 num,CSzData *sd2,CBuf *tempBufs,UInt32 numTempBufs,
             ISzAlloc *alloc)

{
  char cVar1;
  char *pcVar2;
  long lVar3;
  SRes SVar4;
  long lVar5;
  long in_RCX;
  undefined8 *in_RDX;
  uint in_ESI;
  long *in_RDI;
  uint in_R8D;
  undefined8 *in_R9;
  int __result___1;
  UInt32 index;
  int __result__;
  Byte external;
  Byte *defs;
  CNtfsFileTime *vals;
  UInt32 i;
  CSzData sd;
  uint local_6c;
  ISzAlloc *in_stack_ffffffffffffffa0;
  CSzData *in_stack_ffffffffffffffa8;
  UInt32 in_stack_ffffffffffffffb4;
  uint uVar6;
  CSzData *in_stack_ffffffffffffffb8;
  undefined4 *puVar7;
  ulong local_40;
  SRes local_4;
  
  local_4 = ReadBitVector(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4,
                          &in_stack_ffffffffffffffa8->Data,in_stack_ffffffffffffffa0);
  if (local_4 == 0) {
    if (in_RDX[1] == 0) {
      local_4 = 0x10;
    }
    else {
      in_RDX[1] = in_RDX[1] + -1;
      pcVar2 = (char *)*in_RDX;
      *in_RDX = pcVar2 + 1;
      cVar1 = *pcVar2;
      if (cVar1 == '\0') {
        puVar7 = (undefined4 *)*in_RDX;
        local_40 = in_RDX[1];
      }
      else {
        SVar4 = SzReadNumber32(in_stack_ffffffffffffffa8,(UInt32 *)in_stack_ffffffffffffffa0);
        if (SVar4 != 0) {
          return SVar4;
        }
        if (in_R8D <= local_6c) {
          return 0x10;
        }
        puVar7 = *(undefined4 **)(in_RCX + (ulong)local_6c * 0x10);
        local_40 = *(ulong *)(in_RCX + (ulong)local_6c * 0x10 + 8);
      }
      if (in_ESI == 0) {
        in_RDI[1] = 0;
      }
      else {
        lVar5 = (*(code *)*in_R9)(in_R9,(ulong)in_ESI << 3);
        in_RDI[1] = lVar5;
        if (lVar5 == 0) {
          return 2;
        }
      }
      lVar5 = in_RDI[1];
      lVar3 = *in_RDI;
      for (uVar6 = 0; uVar6 < in_ESI; uVar6 = uVar6 + 1) {
        if (((uint)*(byte *)(lVar3 + (ulong)(uVar6 >> 3)) & 0x80 >> ((byte)uVar6 & 7)) == 0) {
          *(undefined4 *)(lVar5 + (ulong)uVar6 * 8) = 0;
          *(undefined4 *)(lVar5 + 4 + (ulong)uVar6 * 8) = 0;
        }
        else {
          if (local_40 < 8) {
            return 0x10;
          }
          *(undefined4 *)(lVar5 + (ulong)uVar6 * 8) = *puVar7;
          *(undefined4 *)(lVar5 + 4 + (ulong)uVar6 * 8) = puVar7[1];
          local_40 = local_40 - 8;
          puVar7 = puVar7 + 2;
        }
      }
      if (cVar1 == '\0') {
        *in_RDX = puVar7;
        in_RDX[1] = local_40;
      }
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

static MY_NO_INLINE SRes ReadTime(CSzBitUi64s *p, UInt32 num,
    CSzData *sd2,
    const CBuf *tempBufs, UInt32 numTempBufs,
    ISzAlloc *alloc)
{
  CSzData sd;
  UInt32 i;
  CNtfsFileTime *vals;
  Byte *defs;
  Byte external;
  
  RINOK(ReadBitVector(sd2, num, &p->Defs, alloc));
  
  SZ_READ_BYTE_SD(sd2, external);
  if (external == 0)
    sd = *sd2;
  else
  {
    UInt32 index;
    RINOK(SzReadNumber32(sd2, &index));
    if (index >= numTempBufs)
      return SZ_ERROR_ARCHIVE;
    sd.Data = tempBufs[index].data;
    sd.Size = tempBufs[index].size;
  }
  
  MY_ALLOC_ZE(CNtfsFileTime, p->Vals, num, alloc);
  vals = p->Vals;
  defs = p->Defs;
  for (i = 0; i < num; i++)
    if (SzBitArray_Check(defs, i))
    {
      if (sd.Size < 8)
        return SZ_ERROR_ARCHIVE;
      vals[i].Low = GetUi32(sd.Data);
      vals[i].High = GetUi32(sd.Data + 4);
      SKIP_DATA2(sd, 8);
    }
    else
      vals[i].High = vals[i].Low = 0;
  
  if (external == 0)
    *sd2 = sd;
  
  return SZ_OK;
}